

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall Memory::Recycler::FinishWrapperObjectTracing(Recycler *this)

{
  DOMWrapperTracingCallback p_Var1;
  bool bVar2;
  RecyclerCollectionWrapper *pRVar3;
  
  do {
    p_Var1 = this->collectionWrapper->wrapperTracingCallback;
    if (p_Var1 != (DOMWrapperTracingCallback)0x0) {
      (*p_Var1)(this->collectionWrapper->wrapperTracingCallbackState);
    }
    ProcessMark(this,false);
    pRVar3 = this->collectionWrapper;
    if (pRVar3->wrapperTracingDoneCallback == (DOMWrapperTracingDoneCallback)0x0) goto LAB_0070f9e4;
    bVar2 = (*pRVar3->wrapperTracingDoneCallback)(pRVar3->wrapperTracingCallbackState);
  } while (!bVar2);
  pRVar3 = this->collectionWrapper;
LAB_0070f9e4:
  if (pRVar3->wrapperTracingCallback != (DOMWrapperTracingCallback)0x0) {
    (*pRVar3->wrapperTracingCallback)(pRVar3->wrapperTracingCallbackState);
  }
  this->needExternalWrapperTracing = false;
  return;
}

Assistant:

void
Recycler::FinishWrapperObjectTracing()
{
    //TODO:akatti:Add ETW event for this.
    // Tracing would have generated more work for mark and marking might generate more work for tracing.
    // We continue until we find no more pending tracing work.
    do
    {
        this->collectionWrapper->EndMarkDomWrapperTracingCallback();
        this->ProcessMark(false);
    } while (!this->collectionWrapper->EndMarkDomWrapperTracingDoneCallback());

    // This is just to wait until tracing has finished.
    this->collectionWrapper->EndMarkDomWrapperTracingCallback();
    this->ClearNeedExternalWrapperTracing();
}